

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O2

void __thiscall chrono::ChLinkDistance::ArchiveOUT(ChLinkDistance *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkDistance>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_30._value = &this->distance;
  local_30._name = "distance";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->pos1;
  local_48._name = "pos1";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->pos2;
  local_60._name = "pos2";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChLinkDistance::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkDistance>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(distance);
    marchive << CHNVP(pos1);
    marchive << CHNVP(pos2);
}